

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_format.cpp
# Opt level: O0

void __thiscall csv::CSVFormat::assert_no_char_overlap(CSVFormat *this)

{
  bool bVar1;
  iterator iVar2;
  iterator __last;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  runtime_error *this_00;
  bool local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  ulong local_138;
  size_t i;
  undefined1 local_128 [8];
  string err_msg;
  _Self local_100;
  _Self local_f8;
  _Self local_f0;
  vector<char,_std::allocator<char>_> *local_e8;
  vector<char,_std::allocator<char>_> *local_e0;
  _Rb_tree_const_iterator<char> local_d8;
  _Rb_tree_const_iterator<char> local_d0;
  _Rb_tree_const_iterator<char> local_c8;
  _Rb_tree_const_iterator<char> local_c0;
  undefined1 auStack_b8 [8];
  vector<char,_std::allocator<char>_> intersection;
  undefined1 local_80 [8];
  set<char,_std::less<char>,_std::allocator<char>_> trims;
  undefined1 local_40 [8];
  set<char,_std::less<char>,_std::allocator<char>_> delims;
  CSVFormat *this_local;
  
  delims._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  iVar2 = std::vector<char,_std::allocator<char>_>::begin(&this->possible_delimiters);
  trims._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::vector<char,_std::allocator<char>_>::end(&this->possible_delimiters);
  std::set<char,std::less<char>,std::allocator<char>>::
  set<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((set<char,std::less<char>,std::allocator<char>> *)local_40,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)iVar2._M_current,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             trims._M_t._M_impl.super__Rb_tree_header._M_node_count);
  iVar2 = std::vector<char,_std::allocator<char>_>::begin(&this->trim_chars);
  __last = std::vector<char,_std::allocator<char>_>::end(&this->trim_chars);
  std::set<char,std::less<char>,std::allocator<char>>::
  set<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((set<char,std::less<char>,std::allocator<char>> *)local_80,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)iVar2._M_current,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)__last._M_current
            );
  auStack_b8 = (undefined1  [8])0x0;
  intersection.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Tp_alloc_type =
       (_Tp_alloc_type)0x0;
  intersection.super__Vector_base<char,_std::allocator<char>_>._M_impl._1_7_ = 0;
  intersection.super__Vector_base<char,_std::allocator<char>_>._M_impl._8_8_ = 0;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)auStack_b8);
  local_c0._M_node =
       (_Base_ptr)
       std::set<char,_std::less<char>,_std::allocator<char>_>::begin
                 ((set<char,_std::less<char>,_std::allocator<char>_> *)local_40);
  local_c8._M_node =
       (_Base_ptr)
       std::set<char,_std::less<char>,_std::allocator<char>_>::end
                 ((set<char,_std::less<char>,_std::allocator<char>_> *)local_40);
  local_d0._M_node =
       (_Base_ptr)
       std::set<char,_std::less<char>,_std::allocator<char>_>::begin
                 ((set<char,_std::less<char>,_std::allocator<char>_> *)local_80);
  local_d8._M_node =
       (_Base_ptr)
       std::set<char,_std::less<char>,_std::allocator<char>_>::end
                 ((set<char,_std::less<char>,_std::allocator<char>_> *)local_80);
  local_e0 = (vector<char,_std::allocator<char>_> *)
             std::back_inserter<std::vector<char,std::allocator<char>>>
                       ((vector<char,_std::allocator<char>_> *)auStack_b8);
  local_e8 = (vector<char,_std::allocator<char>_> *)
             std::
             set_intersection<std::_Rb_tree_const_iterator<char>,std::_Rb_tree_const_iterator<char>,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                       (local_c0,local_c8,local_d0,local_d8,
                        (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)local_e0);
  local_f0._M_node =
       (_Base_ptr)
       std::set<char,_std::less<char>,_std::allocator<char>_>::find
                 ((set<char,_std::less<char>,_std::allocator<char>_> *)local_40,&this->quote_char);
  local_f8._M_node =
       (_Base_ptr)
       std::set<char,_std::less<char>,_std::allocator<char>_>::end
                 ((set<char,_std::less<char>,_std::allocator<char>_> *)local_40);
  bVar1 = std::operator!=(&local_f0,&local_f8);
  local_1a1 = true;
  if (!bVar1) {
    local_100._M_node =
         (_Base_ptr)
         std::set<char,_std::less<char>,_std::allocator<char>_>::find
                   ((set<char,_std::less<char>,_std::allocator<char>_> *)local_80,&this->quote_char)
    ;
    err_msg.field_2._8_8_ =
         std::set<char,_std::less<char>,_std::allocator<char>_>::end
                   ((set<char,_std::less<char>,_std::allocator<char>_> *)local_80);
    local_1a1 = std::operator!=(&local_100,(_Self *)((long)&err_msg.field_2 + 8));
  }
  if (local_1a1 != false) {
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)auStack_b8,&this->quote_char);
  }
  bVar1 = std::vector<char,_std::allocator<char>_>::empty
                    ((vector<char,_std::allocator<char>_> *)auStack_b8);
  if (bVar1) {
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)auStack_b8);
    std::set<char,_std::less<char>,_std::allocator<char>_>::~set
              ((set<char,_std::less<char>,_std::allocator<char>_> *)local_80);
    std::set<char,_std::less<char>,_std::allocator<char>_>::~set
              ((set<char,_std::less<char>,_std::allocator<char>_> *)local_40);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,
             "There should be no overlap between the quote character, the set of possible delimiters and the set of whitespace characters. Offending characters: "
             ,(allocator<char> *)((long)&i + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  for (local_138 = 0; uVar5 = local_138,
      sVar3 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)auStack_b8), uVar5 < sVar3;
      local_138 = local_138 + 1) {
    std::__cxx11::string::operator+=((string *)local_128,"\'");
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)auStack_b8,local_138);
    std::__cxx11::string::operator+=((string *)local_128,*pvVar4);
    std::__cxx11::string::operator+=((string *)local_128,"\'");
    uVar5 = local_138 + 1;
    sVar3 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)auStack_b8);
    if (uVar5 < sVar3) {
      std::__cxx11::string::operator+=((string *)local_128,", ");
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,'.')
  ;
  std::runtime_error::runtime_error(this_00,(string *)&local_158);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CSV_INLINE void CSVFormat::assert_no_char_overlap()
    {
        auto delims = std::set<char>(
            this->possible_delimiters.begin(), this->possible_delimiters.end()),
            trims = std::set<char>(
                this->trim_chars.begin(), this->trim_chars.end());

        // Stores intersection of possible delimiters and trim characters
        std::vector<char> intersection = {};

        // Find which characters overlap, if any
        std::set_intersection(
            delims.begin(), delims.end(),
            trims.begin(), trims.end(),
            std::back_inserter(intersection));

        // Make sure quote character is not contained in possible delimiters
        // or whitespace characters
        if (delims.find(this->quote_char) != delims.end() ||
            trims.find(this->quote_char) != trims.end()) {
            intersection.push_back(this->quote_char);
        }

        if (!intersection.empty()) {
            std::string err_msg = "There should be no overlap between the quote character, "
                "the set of possible delimiters "
                "and the set of whitespace characters. Offending characters: ";

            // Create a pretty error message with the list of overlapping
            // characters
            for (size_t i = 0; i < intersection.size(); i++) {
                err_msg += "'";
                err_msg += intersection[i];
                err_msg += "'";

                if (i + 1 < intersection.size())
                    err_msg += ", ";
            }

            throw std::runtime_error(err_msg + '.');
        }
    }